

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O0

void embree::InstanceArrayRandomTest<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>_>::
     intersectFilter(RTCFilterFunctionNArguments *args)

{
  uint uVar1;
  long lVar2;
  runtime_error *this;
  long *in_RDI;
  uint rayId;
  uint i;
  RayQueryContext *context;
  uint local_24;
  
  lVar2 = in_RDI[2];
  local_24 = 0;
  while( true ) {
    if (*(uint *)(in_RDI + 5) <= local_24) {
      return;
    }
    uVar1 = *(uint *)(in_RDI[3] + (ulong)((int)in_RDI[5] * 10 + local_24) * 4);
    if ((*(int *)(*in_RDI + (ulong)local_24 * 4) != 0) && (0xf < uVar1)) break;
    if (*(int *)(*in_RDI + (ulong)local_24 * 4) != 0) {
      *(int *)(lVar2 + 8 + (ulong)uVar1 * 4) = *(int *)(lVar2 + 8 + (ulong)uVar1 * 4) + 1;
    }
    local_24 = local_24 + 1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Invalid ray id in intersection filter.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void intersectFilter(const RTCFilterFunctionNArguments* args)
    {
      assert(args);
      assert(args->context);

      RayQueryContext* context = (RayQueryContext*)(args->context);

      for (unsigned int i=0; i<args->N; i++) 
      {
        const unsigned int rayId = RTCRayN_id(args->ray, args->N, i);
        if(args->valid[i] && rayId >= 16)
          throw std::runtime_error("Invalid ray id in intersection filter.");
        if (args->valid[i])
        {
          assert(rayId < 16);
          context->numHits[rayId] += 1;
        }
      }
    }